

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

__ssize_t Bstrlib::getline(char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  sgetc parm;
  
  CBString::gets((CBString *)__n,(char *)istreamGetc);
  iVar1 = *(int *)((long)__n + 0xc);
  if ((0 < (long)iVar1) && ((uint)*(byte *)((__n[2] - 1) + (long)iVar1) == (int)(char)__stream)) {
    *(int *)((long)__n + 0xc) = iVar1 + -1;
  }
  return (__ssize_t)__lineptr;
}

Assistant:

std::istream& getline (std::istream& sin, CBString& b, char terminator) {
struct sgetc parm;
	parm.sin = &sin;
	parm.terminator = terminator;
	b.gets ((bNgetc) istreamGetc, &parm, terminator);
	if (b.slen > 0 && b.data[b.slen-1] == terminator) b.slen--;
 	return sin;
}